

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMTypeRef
CompileLlvmFunctionType
          (LlvmCompilationContext *ctx,TypeBase *returnType,ArrayView<TypeBase_*> argumentTypes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  TypeRef *pTVar4;
  TypeBase **ppTVar5;
  LLVMTypeRef pLVar6;
  LLVMTypeRef local_238;
  LLVMTypeRef resultType;
  LLVMTypeRef local_198;
  LLVMTypeRefOpaque *local_190;
  TypeRef *local_188;
  TypeBase *newType_1;
  TypeBase *argumentType;
  LLVMTypeRef pLStack_170;
  uint i;
  LLVMTypeRefOpaque *local_168 [3];
  TypeRef *local_150;
  TypeBase *newType;
  SmallArray<LLVMTypeRefOpaque_*,_32U> arguments;
  bool isStructReturnType;
  TypeBase *returnType_local;
  LlvmCompilationContext *ctx_local;
  ArrayView<TypeBase_*> argumentTypes_local;
  
  ctx_local = (LlvmCompilationContext *)argumentTypes.data;
  argumentTypes_local.data._0_4_ = argumentTypes.count;
  arguments.allocator._7_1_ = IsStructReturnType(returnType);
  SmallArray<LLVMTypeRefOpaque_*,_32U>::SmallArray
            ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&newType,ctx->allocator);
  if ((arguments.allocator._7_1_ & 1) != 0) {
    pTVar4 = ExpressionContext::GetReferenceType(ctx->ctx,returnType);
    local_150 = pTVar4;
    if ((pTVar4->super_TypeBase).typeIndex == 0xffffffff) {
      ppTVar5 = SmallArray<TypeBase_*,_128U>::back(&ctx->ctx->types);
      if (pTVar4 != (TypeRef *)*ppTVar5) {
        __assert_fail("newType == ctx.ctx.types.back()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x1f0,
                      "LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext &, TypeBase *, ArrayView<TypeBase *>)"
                     );
      }
      uVar2 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types);
      ppTVar5 = SmallArray<TypeBase_*,_128U>::back(&ctx->ctx->types);
      (*ppTVar5)->typeIndex = uVar2 - 1;
      local_168[0] = (LLVMTypeRefOpaque *)0x0;
      SmallArray<LLVMTypeRefOpaque_*,_128U>::push_back(&ctx->types,local_168);
    }
    pLStack_170 = CompileLlvmType(ctx,&local_150->super_TypeBase);
    SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back
              ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&newType,&stack0xfffffffffffffe90);
  }
  argumentType._4_4_ = 0;
  do {
    uVar2 = argumentType._4_4_;
    uVar3 = ArrayView<TypeBase_*>::size((ArrayView<TypeBase_*> *)&ctx_local);
    if (uVar3 <= uVar2) {
      if ((arguments.allocator._7_1_ & 1) == 0) {
        local_238 = CompileLlvmType(ctx,returnType);
      }
      else {
        local_238 = LLVMVoidTypeInContext(ctx->context);
      }
      pLVar6 = LLVMFunctionType(local_238,(LLVMTypeRef *)newType,(uint)arguments.data,false);
      SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray
                ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&newType);
      return pLVar6;
    }
    ppTVar5 = ArrayView<TypeBase_*>::operator[]
                        ((ArrayView<TypeBase_*> *)&ctx_local,argumentType._4_4_);
    newType_1 = *ppTVar5;
    bVar1 = IsStructArgumentType(newType_1);
    if (bVar1) {
      pTVar4 = ExpressionContext::GetReferenceType(ctx->ctx,newType_1);
      local_188 = pTVar4;
      if ((pTVar4->super_TypeBase).typeIndex == 0xffffffff) {
        ppTVar5 = SmallArray<TypeBase_*,_128U>::back(&ctx->ctx->types);
        if (pTVar4 != (TypeRef *)*ppTVar5) {
          __assert_fail("newType == ctx.ctx.types.back()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x203,
                        "LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext &, TypeBase *, ArrayView<TypeBase *>)"
                       );
        }
        uVar2 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types);
        ppTVar5 = SmallArray<TypeBase_*,_128U>::back(&ctx->ctx->types);
        (*ppTVar5)->typeIndex = uVar2 - 1;
        local_190 = (LLVMTypeRefOpaque *)0x0;
        SmallArray<LLVMTypeRefOpaque_*,_128U>::push_back(&ctx->types,&local_190);
      }
      local_198 = CompileLlvmType(ctx,&local_188->super_TypeBase);
      SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back
                ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&newType,&local_198);
    }
    else {
      resultType = CompileLlvmType(ctx,newType_1);
      SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back
                ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&newType,&resultType);
    }
    argumentType._4_4_ = argumentType._4_4_ + 1;
  } while( true );
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext& ctx, TypeBase *returnType, ArrayView<TypeBase*> argumentTypes)
{
	bool isStructReturnType = IsStructReturnType(returnType);

	SmallArray<LLVMTypeRef, 32> arguments(ctx.allocator);

	if (isStructReturnType)
	{
		TypeBase* newType = ctx.ctx.GetReferenceType(returnType);

		if (newType->typeIndex == ~0u)
		{
			assert(newType == ctx.ctx.types.back());

			ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
			ctx.types.push_back(NULL);
		}

		arguments.push_back(CompileLlvmType(ctx, newType));
	}

	for (unsigned i = 0; i < argumentTypes.size(); i++)
	{
		TypeBase* argumentType = argumentTypes[i];

		if (IsStructArgumentType(argumentType))
		{
			TypeBase* newType = ctx.ctx.GetReferenceType(argumentType);

			if (newType->typeIndex == ~0u)
			{
				assert(newType == ctx.ctx.types.back());

				ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
				ctx.types.push_back(NULL);
			}

			arguments.push_back(CompileLlvmType(ctx, newType));
		}
		else
		{
			arguments.push_back(CompileLlvmType(ctx, argumentType));
		}
	}

	LLVMTypeRef resultType = isStructReturnType ? LLVMVoidTypeInContext(ctx.context) : CompileLlvmType(ctx, returnType);

	return LLVMFunctionType(resultType, arguments.data, arguments.count, false);
}